

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::
ParameterizedTestSuiteInfo<google::protobuf::(anonymous_namespace)::DynamicMessageTest>::
RegisterTests(ParameterizedTestSuiteInfo<google::protobuf::(anonymous_namespace)::DynamicMessageTest>
              *this)

{
  pointer psVar1;
  pointer pIVar2;
  ParamNameGeneratorFunc *pPVar3;
  _Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<bool,_bool>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<bool,_bool>_>_>_>
  _Var4;
  _Alloc_hider name;
  bool bVar5;
  int iVar6;
  pointer __lhs;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ostream *poVar7;
  size_type sVar8;
  char *pcVar9;
  undefined4 extraout_var_02;
  TestFactoryBase *factory;
  undefined4 extraout_var_03;
  tuple<bool,_bool> *value;
  pointer psVar10;
  size_type index;
  ulong uVar11;
  bool bVar12;
  GTestLog local_1bc;
  int local_1b8;
  _Tuple_impl<0UL,_bool,_bool> local_1b2;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<bool,_bool>_>_*,_false>
  local_1b0;
  char *local_1a8;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<bool,_bool>_>_*,_false>
  local_1a0;
  string local_198;
  size_t local_178;
  _Tuple_impl<0UL,_bool,_bool> *local_170;
  ParamGenerator<std::tuple<bool,_bool>_> generator;
  string test_name;
  string param_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  string test_suite_name;
  string local_a0;
  CodeLocation local_80;
  CodeLocation local_58;
  
  test_suite_name._M_dataplus._M_p = (pointer)&test_suite_name.field_2;
  test_suite_name._M_string_length = 0;
  bVar12 = false;
  test_suite_name.field_2._M_local_buf[0] = '\0';
  test_name._M_dataplus._M_p = (pointer)&test_name.field_2;
  test_name._M_string_length = 0;
  test_name.field_2._M_local_buf[0] = '\0';
  psVar10 = (this->tests_).
            super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::(anonymous_namespace)::DynamicMessageTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::(anonymous_namespace)::DynamicMessageTest>::TestInfo>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->tests_).
           super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::(anonymous_namespace)::DynamicMessageTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::(anonymous_namespace)::DynamicMessageTest>::TestInfo>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (psVar10 == psVar1) {
      if (!bVar12) {
        iVar6 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
                  [2])(this);
        CodeLocation::CodeLocation(&local_80,&this->code_location_);
        InsertSyntheticTestCase
                  ((string *)CONCAT44(extraout_var_03,iVar6),&local_80,
                   (this->tests_).
                   super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::(anonymous_namespace)::DynamicMessageTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::(anonymous_namespace)::DynamicMessageTest>::TestInfo>_>_>
                   ._M_impl.super__Vector_impl_data._M_start !=
                   (this->tests_).
                   super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::(anonymous_namespace)::DynamicMessageTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::(anonymous_namespace)::DynamicMessageTest>::TestInfo>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        std::__cxx11::string::~string((string *)&local_80);
      }
      std::__cxx11::string::~string((string *)&test_name);
      std::__cxx11::string::~string((string *)&test_suite_name);
      return;
    }
    pIVar2 = (this->instantiations_).
             super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::(anonymous_namespace)::DynamicMessageTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::(anonymous_namespace)::DynamicMessageTest>::InstantiationInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__lhs = (this->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::(anonymous_namespace)::DynamicMessageTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::(anonymous_namespace)::DynamicMessageTest>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start; __lhs != pIVar2; __lhs = __lhs + 1) {
      (*__lhs->generator)(&generator);
      pPVar3 = __lhs->name_func;
      local_1a8 = __lhs->file;
      local_1b8 = __lhs->line;
      if ((__lhs->name)._M_string_length == 0) {
        test_suite_name._M_string_length = 0;
        *test_suite_name._M_dataplus._M_p = '\0';
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &test_param_names,&__lhs->name,"/");
        std::__cxx11::string::operator=((string *)&test_suite_name,(string *)&test_param_names);
        std::__cxx11::string::~string((string *)&test_param_names);
      }
      std::__cxx11::string::append((string *)&test_suite_name);
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &test_param_names._M_t._M_impl.super__Rb_tree_header._M_header;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      iVar6 = (*(generator.impl_.
                 super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<bool,_bool>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_vptr_ParamGeneratorInterface[2])();
      local_1b0._M_head_impl =
           (ParamIteratorInterface<std::tuple<bool,_bool>_> *)CONCAT44(extraout_var,iVar6);
      iVar6 = (*(generator.impl_.
                 super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<bool,_bool>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_vptr_ParamGeneratorInterface[3])();
      local_1a0._M_head_impl =
           (ParamIteratorInterface<std::tuple<bool,_bool>_> *)CONCAT44(extraout_var_00,iVar6);
      local_178 = 0;
      while( true ) {
        bVar5 = ParamIterator<std::tuple<bool,_bool>_>::operator!=
                          ((ParamIterator<std::tuple<bool,_bool>_> *)&local_1b0,
                           (ParamIterator<std::tuple<bool,_bool>_> *)&local_1a0);
        if (!bVar5) break;
        iVar6 = (*(local_1b0._M_head_impl)->_vptr_ParamIteratorInterface[5])();
        local_170 = (_Tuple_impl<0UL,_bool,_bool> *)CONCAT44(extraout_var_01,iVar6);
        test_name._M_string_length = 0;
        *test_name._M_dataplus._M_p = '\0';
        local_198._M_dataplus._M_p._0_2_ = *local_170;
        local_198._M_string_length = local_178;
        (*pPVar3)(&param_name,(TestParamInfo<std::tuple<bool,_bool>_> *)&local_198);
        if (param_name._M_string_length == 0) {
          bVar12 = false;
        }
        else {
          for (uVar11 = 0; bVar12 = param_name._M_string_length <= uVar11, !bVar12;
              uVar11 = uVar11 + 1) {
            bVar5 = IsAlNum(param_name._M_dataplus._M_p[uVar11]);
            if ((!bVar5) && (param_name._M_dataplus._M_p[uVar11] != '_')) break;
          }
        }
        bVar12 = IsTrue(bVar12);
        if (!bVar12) {
          GTestLog::GTestLog((GTestLog *)&local_198,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/googletest-src/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x247);
          poVar7 = std::operator<<((ostream *)&std::cerr,
                                   "Condition IsValidParamName(param_name) failed. ");
          poVar7 = std::operator<<(poVar7,"Parameterized test name \'");
          poVar7 = std::operator<<(poVar7,(string *)&param_name);
          poVar7 = std::operator<<(poVar7,
                                   "\' is invalid (contains spaces, dashes, or any non-alphanumeric characters other than underscores), in "
                                  );
          poVar7 = std::operator<<(poVar7,local_1a8);
          poVar7 = std::operator<<(poVar7," line ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_1b8);
          poVar7 = std::operator<<(poVar7,anon_var_dwarf_651463 + 5);
          std::endl<char,std::char_traits<char>>(poVar7);
          GTestLog::~GTestLog((GTestLog *)&local_198);
        }
        sVar8 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&test_param_names,&param_name);
        bVar12 = IsTrue(sVar8 == 0);
        if (!bVar12) {
          GTestLog::GTestLog((GTestLog *)&local_198,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/googletest-src/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x24d);
          poVar7 = std::operator<<((ostream *)&std::cerr,
                                   "Condition test_param_names.count(param_name) == 0 failed. ");
          poVar7 = std::operator<<(poVar7,"Duplicate parameterized test name \'");
          poVar7 = std::operator<<(poVar7,(string *)&param_name);
          poVar7 = std::operator<<(poVar7,"\', in ");
          poVar7 = std::operator<<(poVar7,local_1a8);
          poVar7 = std::operator<<(poVar7," line ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_1b8);
          std::endl<char,std::char_traits<char>>(poVar7);
          GTestLog::~GTestLog((GTestLog *)&local_198);
        }
        if ((((psVar10->
              super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::(anonymous_namespace)::DynamicMessageTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->test_base_name)._M_string_length != 0) {
          pcVar9 = (char *)std::__cxx11::string::append((string *)&test_name);
          std::__cxx11::string::append(pcVar9);
        }
        std::__cxx11::string::append((string *)&test_name);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&test_param_names,&param_name);
        std::__cxx11::string::string((string *)&local_a0,(string *)&test_suite_name);
        name = test_name._M_dataplus;
        PrintToString<std::tuple<bool,bool>>(&local_198,(testing *)local_170,value);
        pcVar9 = (char *)CONCAT62(local_198._M_dataplus._M_p._2_6_,local_198._M_dataplus._M_p._0_2_)
        ;
        CodeLocation::CodeLocation
                  (&local_58,
                   &((psVar10->
                     super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::(anonymous_namespace)::DynamicMessageTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->code_location);
        iVar6 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
                  [3])(this);
        bVar12 = IsTrue(true);
        if (!bVar12) {
          GTestLog::GTestLog(&local_1bc,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/googletest-src/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x201);
          poVar7 = std::operator<<((ostream *)&std::cerr,
                                   "Condition !test_case_fp || !test_suite_fp failed. ");
          poVar7 = std::operator<<(poVar7,
                                   "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                                  );
          poVar7 = std::operator<<(poVar7,local_1a8);
          poVar7 = std::operator<<(poVar7,":");
          std::ostream::operator<<(poVar7,local_1b8);
          GTestLog::~GTestLog(&local_1bc);
        }
        bVar12 = IsTrue(true);
        if (!bVar12) {
          GTestLog::GTestLog(&local_1bc,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/googletest-src/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x216);
          poVar7 = std::operator<<((ostream *)&std::cerr,
                                   "Condition !test_case_fp || !test_suite_fp failed. ");
          poVar7 = std::operator<<(poVar7,
                                   "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                                  );
          poVar7 = std::operator<<(poVar7,local_1a8);
          poVar7 = std::operator<<(poVar7,":");
          std::ostream::operator<<(poVar7,local_1b8);
          GTestLog::~GTestLog(&local_1bc);
        }
        _Var4.
        super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<bool,_bool>_>_*,_false>
        ._M_head_impl =
             (((psVar10->
               super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::(anonymous_namespace)::DynamicMessageTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->test_meta_factory)._M_t.
             super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<std::tuple<bool,_bool>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<bool,_bool>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<bool,_bool>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<bool,_bool>_>_>_>
             .
             super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<bool,_bool>_>_*,_false>
        ;
        local_1b2 = *local_170;
        factory = (TestFactoryBase *)
                  (**(code **)(*(long *)_Var4.
                                        super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<bool,_bool>_>_*,_false>
                                        ._M_head_impl + 0x10))
                            (_Var4.
                             super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<bool,_bool>_>_*,_false>
                             ._M_head_impl,&local_1b2);
        MakeAndRegisterTestInfo
                  (&local_a0,name._M_p,(char *)0x0,pcVar9,&local_58,
                   (TypeId)CONCAT44(extraout_var_02,iVar6),(SetUpTestSuiteFunc)0x0,
                   (TearDownTestSuiteFunc)0x0,factory);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_a0);
        local_178 = local_178 + 1;
        std::__cxx11::string::~string((string *)&param_name);
        bVar12 = true;
        (*(local_1b0._M_head_impl)->_vptr_ParamIteratorInterface[3])();
      }
      if (local_1a0._M_head_impl != (ParamIteratorInterface<std::tuple<bool,_bool>_> *)0x0) {
        (*(local_1a0._M_head_impl)->_vptr_ParamIteratorInterface[1])();
      }
      if (local_1b0._M_head_impl != (ParamIteratorInterface<std::tuple<bool,_bool>_> *)0x0) {
        (*(local_1b0._M_head_impl)->_vptr_ParamIteratorInterface[1])();
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&test_param_names._M_t);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&generator.impl_.
                  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<bool,_bool>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    psVar10 = psVar10 + 1;
  } while( true );
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    std::string test_suite_name;
    std::string test_name;
    for (const std::shared_ptr<TestInfo>& test_info : tests_) {
      for (const InstantiationInfo& instantiation : instantiations_) {
        const std::string& instantiation_name = instantiation.name;
        ParamGenerator<ParamType> generator((*instantiation.generator)());
        ParamNameGeneratorFunc* name_func = instantiation.name_func;
        const char* file = instantiation.file;
        int line = instantiation.line;

        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        else
          test_suite_name.clear();
        test_suite_name += test_suite_name_;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (const auto& param : generator) {
          generated_instantiations = true;

          test_name.clear();

          std::string param_name =
              name_func(TestParamInfo<ParamType>(param, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid (contains spaces, dashes, or any "
                 "non-alphanumeric characters other than underscores), in "
              << file << " line " << line << "" << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          if (!test_info->test_base_name.empty()) {
            test_name.append(test_info->test_base_name).append("/");
          }
          test_name += param_name;

          test_param_names.insert(std::move(param_name));

          MakeAndRegisterTestInfo(
              test_suite_name, test_name.c_str(),
              nullptr,  // No type parameter.
              PrintToString(param).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(param));
          ++i;
        }  // for param
      }  // for instantiation
    }  // for test_info

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }